

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

void sg_init_pass(sg_pass pass_id,sg_pass_desc *desc)

{
  _sg_pass_t *pass;
  long lVar1;
  sg_pass_desc *psVar2;
  sg_pass_desc desc_def;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e36,"void sg_init_pass(sg_pass, const sg_pass_desc *)");
  }
  psVar2 = &desc_def;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)psVar2 = *(undefined8 *)desc;
    desc = (sg_pass_desc *)&desc->color_attachments[0].mip_level;
    psVar2 = (sg_pass_desc *)((long)psVar2 + 8);
  }
  pass = _sg_lookup_pass((_sg_pools_t *)(ulong)pass_id.id,(uint32_t)desc);
  if (pass != (_sg_pass_t *)0x0) {
    if ((pass->slot).state != SG_RESOURCESTATE_ALLOC) {
      _sg_log("sg_init_pass: pass must be in alloc state\n");
      return;
    }
    _sg_init_pass(pass,&desc_def);
    if (((pass->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
      __assert_fail("(pass->slot.state == SG_RESOURCESTATE_VALID) || (pass->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3e3c,"void sg_init_pass(sg_pass, const sg_pass_desc *)");
    }
  }
  return;
}

Assistant:

inline void sg_init_pass(sg_pass pass_id, const sg_pass_desc& desc) { return sg_init_pass(pass_id, &desc); }